

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O3

int check_for_multi(vocoldef *dolist)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar1 = voclistlen(dolist);
  if ((int)uVar1 < 1) {
    uVar2 = 0;
  }
  else {
    lVar3 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 | *(uint *)((long)&dolist->vocolflg + lVar3) & 0x89;
      lVar3 = lVar3 + 0x28;
    } while ((ulong)uVar1 * 0x28 != lVar3);
  }
  return uVar2;
}

Assistant:

static int check_for_multi(vocoldef *dolist)
{
    int dolen;
    int i;
    int result;

    /* presume we won't find any flags */
    result = 0;

    /* 
     *   scan the list for ALL, ANY, or THEM flags, combining any such
     *   flags we find into the result 
     */
    dolen = voclistlen(dolist);
    for (i = 0 ; i < dolen ; ++i)
        result |= (dolist[i].vocolflg & (VOCS_ALL | VOCS_ANY | VOCS_THEM));

    /* return the result */
    return result;
}